

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

void __thiscall JFSON::Json::Json(Json *this)

{
  Statics *pSVar1;
  Json *this_local;
  
  pSVar1 = statics();
  std::shared_ptr<JFSON::JsonValue>::shared_ptr(&this->m_ptr,&pSVar1->null);
  return;
}

Assistant:

Json::Json() noexcept                  : m_ptr(statics().null) {}